

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

void M_Ticker(void)

{
  int iVar1;
  int i;
  ulong uVar2;
  long lVar3;
  
  DMenu::MenuTime = DMenu::MenuTime + 1;
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[9])();
    lVar3 = 0;
    uVar2 = 0;
    do {
      if ((((char)MenuButtons[0].Keys[lVar3 * 2 + 6] != '\0') &&
          (iVar1 = *(int *)((long)MenuButtonTickers + lVar3), 0 < iVar1)) &&
         (*(int *)((long)MenuButtonTickers + lVar3) = iVar1 + -1, iVar1 == 1)) {
        *(undefined4 *)((long)MenuButtonTickers + lVar3) = 3;
        (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[8])
                  (DMenu::CurrentMenu,uVar2 & 0xffffffff,(ulong)MenuButtonOrigin[uVar2]);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 4;
    } while (uVar2 != 9);
    if (BackbuttonTime < 1) {
      if (0.0 < BackbuttonAlpha) {
        BackbuttonAlpha = BackbuttonAlpha + -0.1;
      }
      if (BackbuttonAlpha < 0.0) {
        BackbuttonAlpha = 0.0;
      }
    }
    else {
      if (BackbuttonAlpha < 1.0) {
        BackbuttonAlpha = BackbuttonAlpha + 0.1;
      }
      if (1.0 < BackbuttonAlpha) {
        BackbuttonAlpha = 1.0;
      }
      BackbuttonTime = BackbuttonTime + -1;
    }
  }
  return;
}

Assistant:

void M_Ticker (void) 
{
	DMenu::MenuTime++;
	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		DMenu::CurrentMenu->Ticker();

		for (int i = 0; i < NUM_MKEYS; ++i)
		{
			if (MenuButtons[i].bDown)
			{
				if (MenuButtonTickers[i] > 0 &&	--MenuButtonTickers[i] <= 0)
				{
					MenuButtonTickers[i] = KEY_REPEAT_RATE;
					DMenu::CurrentMenu->MenuEvent(i, MenuButtonOrigin[i]);
				}
			}
		}
		if (BackbuttonTime > 0)
		{
			if (BackbuttonAlpha < 1.f) BackbuttonAlpha += .1f;
			if (BackbuttonAlpha > 1.f) BackbuttonAlpha = 1.f;
			BackbuttonTime--;
		}
		else
		{
			if (BackbuttonAlpha > 0) BackbuttonAlpha -= .1f;
			if (BackbuttonAlpha < 0) BackbuttonAlpha = 0;
		}
	}
}